

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pop3.c
# Opt level: O0

CURLcode pop3_state_starttls_resp(connectdata *conn,int pop3code,pop3state instate)

{
  SessionHandle *data;
  CURLcode result;
  pop3state instate_local;
  int pop3code_local;
  connectdata *conn_local;
  
  if (pop3code == 0x2b) {
    data._4_4_ = pop3_perform_upgrade_tls(conn);
  }
  else if ((conn->data->set).use_ssl == CURLUSESSL_TRY) {
    data._4_4_ = pop3_perform_authentication(conn);
  }
  else {
    Curl_failf(conn->data,"STARTTLS denied. %c",(ulong)(uint)pop3code);
    data._4_4_ = CURLE_USE_SSL_FAILED;
  }
  return data._4_4_;
}

Assistant:

static CURLcode pop3_state_starttls_resp(struct connectdata *conn,
                                         int pop3code,
                                         pop3state instate)
{
  CURLcode result = CURLE_OK;
  struct SessionHandle *data = conn->data;

  (void)instate; /* no use for this yet */

  if(pop3code != '+') {
    if(data->set.use_ssl != CURLUSESSL_TRY) {
      failf(data, "STARTTLS denied. %c", pop3code);
      result = CURLE_USE_SSL_FAILED;
    }
    else
      result = pop3_perform_authentication(conn);
  }
  else
    result = pop3_perform_upgrade_tls(conn);

  return result;
}